

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

void __thiscall TadsListenerThread::list_threads(TadsListenerThread *this,NetString *buf)

{
  OS_Counter *pOVar1;
  TadsServerThread *pTVar2;
  StringRef *pSVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex->h);
  for (pTVar2 = this->servers; pTVar2 != (TadsServerThread *)0x0; pTVar2 = pTVar2->next_server) {
    pthread_mutex_lock((pthread_mutex_t *)&pTVar2->mutex->h);
    pSVar3 = pTVar2->state;
    LOCK();
    pOVar1 = &(pSVar3->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&pTVar2->mutex->h);
    NetString::appendf(buf,"Thread ID=%d (thread object=%lx): %s<br>",(ulong)(uint)pTVar2->thread_id
                       ,pTVar2,pSVar3->str);
    LOCK();
    pOVar1 = &(pSVar3->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pSVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(pSVar3);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex->h);
  return;
}

Assistant:

void TadsListenerThread::list_threads(NetString *buf)
{
    /* protect against concurrent access */
    mutex->lock();

    /* scan threads */
    for (TadsServerThread *cur = servers ; cur != 0 ; cur = cur->next_server)
    {
        /* report on this thread */
        StringRef *state = cur->get_state();
        buf->appendf("Thread ID=%d (thread object=%lx): %s<br>",
                     cur->thread_id, (unsigned long)cur, state->get());

        /* done with the state string */
        state->release_ref();
    }

    /* done with concurrent access protection */
    mutex->unlock();
}